

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_poller_add(green_poller_t poller,green_future_t future)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  undefined8 uVar5;
  
  fwrite("green_poller_add()\n",0x13,1,_stderr);
  iVar4 = 1;
  if ((future != (green_future_t)0x0 && poller != (green_poller_t)0x0) &&
     (future->loop == poller->loop)) {
    if (future->poller == (green_poller_t)0x0) {
      if (poller->used != poller->size) {
        if (poller->refs < 1) {
          pcVar3 = "poller->refs > 0";
          uVar5 = 0x1e1;
        }
        else if (future->refs < 1) {
          pcVar3 = "future->refs > 0";
          uVar5 = 0x1e2;
        }
        else if (future->slot < 0) {
          if (poller->used <= poller->size) {
            green_poller_dump(poller);
            green_future_acquire(future);
            sVar1 = poller->used;
            poller->futures[sVar1] = future;
            poller->used = sVar1 + 1;
            future->slot = (int)sVar1;
            future->poller = poller;
            if (future->state != green_future_pending) {
              return 0;
            }
            sVar2 = poller->busy;
            poller->busy = sVar2 + 1;
            green_poller_swap(poller,(int)sVar1,(int)sVar2);
            return 0;
          }
          pcVar3 = "poller->used <= poller->size";
          uVar5 = 0x1e5;
        }
        else {
          pcVar3 = "future->slot < 0";
          uVar5 = 0x1e3;
        }
        fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                ,uVar5);
        fflush(_stderr);
        abort();
      }
      iVar4 = 7;
    }
    else {
      iVar4 = 5;
    }
  }
  return iVar4;
}

Assistant:

int green_poller_add(green_poller_t poller, green_future_t future)
{
    fprintf(stderr, "green_poller_add()\n");

    // Check for required arguments.
    if ((poller == NULL) || (future == NULL)) {
        return GREEN_EINVAL;
    }

    // Event loop must match.
    if (future->loop != poller->loop) {
        return GREEN_EINVAL;
    }

    // Future cannot be registered twice.
    if (future->poller != NULL) {
        return GREEN_EALREADY;
    }

    // Cannot exceed maximum poller size.
    if (poller->used == poller->size) {
        return GREEN_ENFILE;
    }

    green_assert(poller->refs > 0);
    green_assert(future->refs > 0);
    green_assert(future->slot < 0);
    green_assert(poller->used >= 0);
    green_assert(poller->used <= poller->size);

    green_poller_dump(poller);

    green_future_acquire(future);
    poller->futures[poller->used] = future;
    future->slot = poller->used++;
    future->poller = poller;
    if (future->state == green_future_pending) {
        green_poller_swap(poller, future->slot, poller->busy++);
    }

    return GREEN_SUCCESS;
}